

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitcell.h
# Opt level: O0

CellGeometry * __thiscall
CIF::UnitCell::getCellGeometry(CellGeometry *__return_storage_ptr__,UnitCell *this)

{
  UnitCell *this_local;
  
  CellGeometry::CellGeometry(__return_storage_ptr__,&this->geometry);
  return __return_storage_ptr__;
}

Assistant:

CellGeometry getCellGeometry() { return geometry; }